

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::pipeline::anon_unknown_0::AlphaToOneTest::createMultisampleTestInstance
          (AlphaToOneTest *this,Context *context,VkPrimitiveTopology topology,
          vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *vertices,
          VkPipelineMultisampleStateCreateInfo *multisampleStateParams,
          VkPipelineColorBlendAttachmentState *colorBlendState)

{
  AlphaToOneInstance *this_00;
  VkPipelineColorBlendAttachmentState *colorBlendState_local;
  VkPipelineMultisampleStateCreateInfo *multisampleStateParams_local;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *vertices_local;
  VkPrimitiveTopology topology_local;
  Context *context_local;
  AlphaToOneTest *this_local;
  
  this_00 = (AlphaToOneInstance *)operator_new(0x88);
  AlphaToOneInstance::AlphaToOneInstance
            (this_00,context,topology,vertices,multisampleStateParams,colorBlendState);
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* AlphaToOneTest::createMultisampleTestInstance (Context&										context,
															 VkPrimitiveTopology							topology,
															 const std::vector<Vertex4RGBA>&				vertices,
															 const VkPipelineMultisampleStateCreateInfo&	multisampleStateParams,
															 const VkPipelineColorBlendAttachmentState&		colorBlendState) const
{
	return new AlphaToOneInstance(context, topology, vertices, multisampleStateParams, colorBlendState);
}